

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.c
# Opt level: O3

_Bool build_pipeline(ecs_world_t *world,ecs_entity_t pipeline,EcsPipelineQuery *pq)

{
  int32_t *piVar1;
  int iVar2;
  int iVar3;
  ecs_query_t *query;
  long lVar4;
  _Bool _Var5;
  _Bool _Var6;
  uint uVar7;
  char *pcVar8;
  ecs_map_t *map;
  void *pvVar9;
  ecs_sig_column_t *peVar10;
  int *piVar11;
  ecs_sig_column_t *column;
  byte bVar12;
  byte bVar13;
  ulong uVar14;
  long lVar15;
  ecs_vector_t *ops;
  write_state_t ws;
  ecs_iter_t it;
  ecs_vector_t *local_148;
  write_state_t local_140;
  EcsPipelineQuery *local_130;
  ecs_world_t *local_128;
  long local_120;
  int *local_118;
  ecs_iter_t local_110;
  
  ecs_query_iter(&local_110,pq->query);
  iVar2 = pq->match_count;
  iVar3 = pq->query->match_count;
  if (iVar2 != iVar3) {
    pcVar8 = ecs_get_name(world,pipeline);
    _ecs_trace(2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/modules/pipeline/pipeline.c"
               ,0xba,"rebuilding pipeline #[green]%s",pcVar8);
    piVar1 = &(world->stats).pipeline_build_count_total;
    *piVar1 = *piVar1 + 1;
    map = _ecs_map_new(4,4,0x100);
    local_140.wildcard = false;
    local_148 = (ecs_vector_t *)0x0;
    query = pq->build_query;
    local_140.components = map;
    local_130 = pq;
    if (pq->ops != (ecs_vector_t *)0x0) {
      ecs_vector_free(pq->ops);
    }
    ecs_query_iter(&local_110,query);
    _Var5 = ecs_query_next(&local_110);
    if (_Var5) {
      piVar11 = (int *)0x0;
      local_128 = world;
      do {
        pvVar9 = ecs_column_w_size(&local_110,0x50,1);
        if (0 < local_110.count) {
          lVar15 = 0;
          do {
            lVar4 = *(long *)((long)pvVar9 + lVar15 * 0x50 + 0x18);
            if (lVar4 != 0) {
              local_118 = piVar11;
              _Var5 = ecs_has_entity(world,local_110.entities[lVar15],0x105);
              uVar7 = ecs_vector_count(*(ecs_vector_t **)(lVar4 + 0x10));
              local_120 = lVar4;
              peVar10 = (ecs_sig_column_t *)
                        _ecs_vector_first(*(ecs_vector_t **)(lVar4 + 0x10),0x28,0x10);
              if ((int)uVar7 < 1) {
LAB_0012d594:
                piVar11 = local_118;
                if (local_118 == (int *)0x0) goto LAB_0012d5c5;
              }
              else {
                uVar14 = (ulong)uVar7;
                bVar12 = 0;
                do {
                  bVar13 = bVar12;
                  _Var6 = check_column(peVar10,!_Var5,&local_140);
                  world = local_128;
                  peVar10 = peVar10 + 1;
                  uVar14 = uVar14 - 1;
                  bVar12 = bVar13 | _Var6;
                } while (uVar14 != 0);
                if (bVar13 == 0 && !_Var6) goto LAB_0012d594;
                ecs_map_clear(local_140.components);
                lVar4 = local_120;
                local_140.wildcard = false;
                if (_Var5) {
LAB_0012d5a0:
                  _ecs_assert(true,0xc,(char *)0x0,"needs_merge == false",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/modules/pipeline/pipeline.c"
                              ,0xf0);
                }
                else {
                  uVar7 = ecs_vector_count(*(ecs_vector_t **)(local_120 + 0x10));
                  peVar10 = (ecs_sig_column_t *)
                            _ecs_vector_first(*(ecs_vector_t **)(lVar4 + 0x10),0x28,0x10);
                  if ((int)uVar7 < 1) goto LAB_0012d5a0;
                  uVar14 = (ulong)uVar7;
                  bVar12 = 0;
                  do {
                    _Var6 = check_column(peVar10,true,&local_140);
                    bVar12 = bVar12 | _Var6;
                    peVar10 = peVar10 + 1;
                    uVar14 = uVar14 - 1;
                  } while (uVar14 != 0);
                  _ecs_assert((_Bool)(bVar12 ^ 1),0xc,(char *)0x0,"needs_merge == false",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/modules/pipeline/pipeline.c"
                              ,0xf0);
                  if ((_Bool)(bVar12 ^ 1) == false) {
                    __assert_fail("needs_merge == 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/modules/pipeline/pipeline.c"
                                  ,0xf0,
                                  "_Bool build_pipeline(ecs_world_t *, ecs_entity_t, EcsPipelineQuery *)"
                                 );
                  }
                }
LAB_0012d5c5:
                piVar11 = (int *)_ecs_vector_add(&local_148,4,0x10);
                *piVar11 = 0;
              }
              if (!_Var5) {
                *piVar11 = *piVar11 + 1;
              }
            }
            lVar15 = lVar15 + 1;
          } while (lVar15 < local_110.count);
        }
        _Var5 = ecs_query_next(&local_110);
        map = local_140.components;
      } while (_Var5);
    }
    ecs_map_free(map);
    local_130->match_count = local_130->query->match_count;
    local_130->ops = local_148;
  }
  return iVar2 != iVar3;
}

Assistant:

static
bool build_pipeline(
    ecs_world_t *world,
    ecs_entity_t pipeline,
    EcsPipelineQuery *pq)
{
    (void)pipeline;

    ecs_query_iter(pq->query);

    if (pq->match_count == pq->query->match_count) {
        /* No need to rebuild the pipeline */
        return false;
    }

    ecs_trace_2("rebuilding pipeline #[green]%s", 
        ecs_get_name(world, pipeline));

    world->stats.pipeline_build_count_total ++;

    write_state_t ws = {
        .components = ecs_map_new(int32_t, ECS_HI_COMPONENT_ID),
        .wildcard = false
    };

    ecs_pipeline_op_t *op = NULL;
    ecs_vector_t *ops = NULL;
    ecs_query_t *query = pq->build_query;

    if (pq->ops) {
        ecs_vector_free(pq->ops);
    }

    /* Iterate systems in pipeline, add ops for running / merging */
    ecs_iter_t it = ecs_query_iter(query);
    while (ecs_query_next(&it)) {
        EcsSystem *sys = ecs_column(&it, EcsSystem, 1);        

        int i;
        for (i = 0; i < it.count; i ++) {            
            ecs_query_t *q = sys[i].query;
            if (!q) {
                continue;
            }

            bool needs_merge = false;
            bool is_active = !ecs_has_entity(
                world, it.entities[i], EcsInactive);

            ecs_vector_each(q->sig.columns, ecs_sig_column_t, column, {
                needs_merge |= check_column(column, is_active, &ws);
            });

            if (needs_merge) {
                /* After merge all components will be merged, so reset state */
                reset_write_state(&ws);
                op = NULL;

                /* Re-evaluate columns to set write flags if system is active.
                 * If system is inactive, it can't write anything and so it
                 * should not insert unnecessary merges.  */
                needs_merge = false;
                if (is_active) {
                    ecs_vector_each(q->sig.columns, ecs_sig_column_t, column, {
                        needs_merge |= check_column(column, true, &ws);
                    });
                }

                /* The component states were just reset, so if we conclude that
                 * another merge is needed something is wrong. */
                ecs_assert(needs_merge == false, ECS_INTERNAL_ERROR, NULL);        
            }

            if (!op) {
                op = ecs_vector_add(&ops, ecs_pipeline_op_t);
                op->count = 0;
            }

            /* Don't increase count for inactive systems, as they are ignored by
             * the query used to run the pipeline. */
            if (is_active) {
                op->count ++;
            }
        }
    }

    ecs_map_free(ws.components);

    /* Force sort of query as this could increase the match_count */
    pq->match_count = pq->query->match_count;
    pq->ops = ops;

    return true;
}